

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void * __thiscall ImGuiStorage::GetVoidPtr(ImGuiStorage *this,ImGuiID key)

{
  Pair *pPVar1;
  Pair *pPVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  pPVar1 = (this->Data).Data;
  uVar5 = (this->Data).Size;
  lVar3 = (long)(int)uVar5;
  pPVar2 = pPVar1;
  if (0 < lVar3) {
    do {
      uVar4 = uVar5 >> 1;
      if (pPVar2[uVar4].key < key) {
        pPVar2 = pPVar2 + (ulong)uVar4 + 1;
        uVar4 = uVar5 + ~uVar4;
      }
      uVar5 = uVar4;
    } while (0 < (int)uVar5);
  }
  if ((pPVar2 != pPVar1 + lVar3) && (pPVar2->key == key)) {
    return (pPVar2->field_1).val_p;
  }
  return (void *)0x0;
}

Assistant:

inline iterator             end()                           { return Data + Size; }